

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O1

char * string_concat(char *a,char *s,char *e)

{
  size_t __n;
  char *__dest;
  size_t __n_00;
  
  if (a == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(a);
  }
  __n_00 = (long)e - (long)s;
  __dest = (char *)malloc(__n + __n_00 + 1);
  if (__dest != (char *)0x0) {
    if (a != (char *)0x0) {
      memcpy(__dest,a,__n);
    }
    memcpy(__dest + __n,s,__n_00);
    __dest[__n + __n_00] = '\0';
  }
  return __dest;
}

Assistant:

static
char* string_concat(const char* a, const char* s, const char* e)
{
   size_t an;
   size_t sn;
   char*  p;
       
   an = a ? strlen(a) : 0;
   sn = (size_t)(e - s);
   p = (char*)(memory_realloc(0, an + sn + 1));
   if (p)
   {
       if (a)
           memcpy(p, a, an);
       memcpy(p + an, s, sn);
       p[an + sn] = '\0';
   }

   return p;
}